

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# krunxx.cpp
# Opt level: O0

void run_acquisition(device *dev,config *c)

{
  acq_state state;
  int iVar1;
  ostream *poVar2;
  rep rVar3;
  char *pcVar4;
  size_t sVar5;
  size_t __nbytes;
  undefined1 auVar6 [16];
  duration<long,_std::ratio<1L,_1000000000L>_> local_230;
  duration<long,_std::ratio<1L,_1000L>_> local_228;
  double local_220;
  double duration;
  time_point toc;
  time_point tic;
  frame_ended_handler local_1e8;
  frame_started_handler local_1b8;
  rep local_198;
  duration<long,_std::ratio<1L,_1000L>_> local_190;
  undefined1 local_188 [8];
  acquisition<katherine::acq::f_toa_tot> acq;
  config *c_local;
  device *dev_local;
  
  acq.pixels_received_handler_._M_invoker = (_Invoker_type)c;
  local_190.__r = (rep)ms<(char)53,(char)48,(char)48>();
  local_198 = (rep)s<(char)49,(char)48>();
  __nbytes = 0x180000;
  katherine::acquisition<katherine::acq::f_toa_tot>::
  acquisition<long,std::ratio<1l,1000l>,long,std::ratio<1l,1l>>
            ((acquisition<katherine::acq::f_toa_tot> *)local_188,dev,0xc7ffffe,0x180000,local_190,
             (duration<long,_std::ratio<1L,_1L>_>)local_198,true);
  std::function<void(int)>::function<void(&)(int),void>
            ((function<void(int)> *)&local_1b8,frame_started);
  katherine::base_acquisition::set_frame_started_handler((base_acquisition *)local_188,&local_1b8);
  std::function<void_(int)>::~function(&local_1b8);
  std::function<void(int,bool,katherine_frame_info_const&)>::
  function<void(&)(int,bool,katherine_frame_info_const&),void>
            ((function<void(int,bool,katherine_frame_info_const&)> *)&local_1e8,frame_ended);
  katherine::base_acquisition::set_frame_ended_handler((base_acquisition *)local_188,&local_1e8);
  std::function<void_(int,_bool,_const_katherine_frame_info_&)>::~function(&local_1e8);
  std::function<void(katherine_px_f_toa_tot_const*,unsigned_long)>::
  function<void(&)(katherine_px_f_toa_tot_const*,unsigned_long),void>
            ((function<void(katherine_px_f_toa_tot_const*,unsigned_long)> *)&tic,pixels_received);
  katherine::acquisition<katherine::acq::f_toa_tot>::set_pixels_received_handler
            ((acquisition<katherine::acq::f_toa_tot> *)local_188,(pixels_received_handler *)&tic);
  std::function<void_(const_katherine_px_f_toa_tot_*,_unsigned_long)>::~function
            ((function<void_(const_katherine_px_f_toa_tot_*,_unsigned_long)> *)&tic);
  katherine::base_acquisition::begin
            ((base_acquisition *)local_188,(config *)acq.pixels_received_handler_._M_invoker,
             data_driven);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Acquisition started.");
  iVar1 = 0x10e058;
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  auVar6 = std::chrono::_V2::steady_clock::now();
  toc.__d.__r = auVar6._0_8_;
  katherine::base_acquisition::read((base_acquisition *)local_188,iVar1,auVar6._8_8_,__nbytes);
  duration = (double)std::chrono::_V2::steady_clock::now();
  local_230.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&duration,&toc);
  local_228.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_230);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_228);
  local_220 = (double)rVar3 / 1000.0;
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Acquisition completed:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," - state: ");
  state = katherine::base_acquisition::state((base_acquisition *)local_188);
  pcVar4 = katherine::str_acq_state(state);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," - received ");
  iVar1 = katherine::base_acquisition::completed_frames((base_acquisition *)local_188);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," complete frames");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," - dropped ");
  sVar5 = katherine::base_acquisition::dropped_measurement_data((base_acquisition *)local_188);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar5);
  poVar2 = std::operator<<(poVar2," measurement data items");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," - total hits: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,n_hits);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," - total duration: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_220);
  poVar2 = std::operator<<(poVar2," s");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," - throughput: ");
  auVar6._8_4_ = (int)(n_hits >> 0x20);
  auVar6._0_8_ = n_hits;
  auVar6._12_4_ = 0x45300000;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,((auVar6._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)n_hits) - 4503599627370496.0)) /
                             local_220);
  poVar2 = std::operator<<(poVar2," hits/s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  katherine::acquisition<katherine::acq::f_toa_tot>::~acquisition
            ((acquisition<katherine::acq::f_toa_tot> *)local_188);
  return;
}

Assistant:

void
run_acquisition(katherine::device& dev, const katherine::config& c)
{
    using namespace std::chrono;
    using namespace std::literals::chrono_literals;

    katherine::acquisition<mode> acq{dev, katherine::md_size * 34952533, sizeof(mode::pixel_type) * 65536, 500ms, 10s, true};

    acq.set_frame_started_handler(frame_started);
    acq.set_frame_ended_handler(frame_ended);
    acq.set_pixels_received_handler(pixels_received);

    acq.begin(c, katherine::readout_type::data_driven);
    std::cerr << "Acquisition started." << std::endl;

    auto tic = steady_clock::now();
    acq.read();
    auto toc = steady_clock::now();

    double duration = duration_cast<milliseconds>(toc - tic).count() / 1000.;
    std::cerr << std::endl;
    std::cerr << "Acquisition completed:" << std::endl
                << " - state: " << katherine::str_acq_state(acq.state()) << std::endl
                << " - received " << acq.completed_frames() << " complete frames" << std::endl
                << " - dropped " << acq.dropped_measurement_data() << " measurement data items" << std::endl
                << " - total hits: " << n_hits << std::endl
                << " - total duration: " << duration << " s" << std::endl
                << " - throughput: " << (n_hits / duration) << " hits/s" << std::endl;
}